

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::basic_bson_encoder
          (basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
           *this,bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *sink,
          bson_encode_options *options,allocator<char> *alloc)

{
  bson_encode_options *in_RCX;
  undefined8 *in_RSI;
  bson_encode_options *in_RDI;
  
  basic_json_visitor<char>::basic_json_visitor((basic_json_visitor<char> *)in_RDI);
  in_RDI->_vptr_bson_encode_options = (_func_int **)&PTR__basic_bson_encoder_01333888;
  *(undefined8 *)&in_RDI->field_0x8 = *in_RSI;
  bson_encode_options::bson_encode_options(in_RCX,in_RDI);
  std::allocator<char>::allocator((allocator *)&in_RDI[1].field_0x10);
  std::
  vector<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  ::vector((vector<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
            *)0x1df131);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1df13e);
  *(undefined4 *)&in_RDI[4]._vptr_bson_encode_options = 0;
  return;
}

Assistant:

explicit basic_bson_encoder(Sink&& sink, 
                                const bson_encode_options& options, 
                                const Allocator& alloc = Allocator())
       : sink_(std::forward<Sink>(sink)),
         options_(options),
         alloc_(alloc)
    {
    }